

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3InsertBuiltinFuncs(FuncDef *aDef,int nDef)

{
  char *z;
  int iVar1;
  FuncDef *pFVar2;
  int h;
  int nName;
  char *zName;
  FuncDef *pOther;
  int i;
  int nDef_local;
  FuncDef *aDef_local;
  
  for (pOther._0_4_ = 0; (int)pOther < nDef; pOther._0_4_ = (int)pOther + 1) {
    z = aDef[(int)pOther].zName;
    iVar1 = sqlite3Strlen30(z);
    iVar1 = (*z + iVar1) % 0x17;
    pFVar2 = functionSearch(iVar1,z);
    if (pFVar2 == (FuncDef *)0x0) {
      aDef[(int)pOther].pNext = (FuncDef *)0x0;
      aDef[(int)pOther].u = *(anon_union_8_2_1d015ad6_for_u *)(sqlite3BuiltinFunctions.a + iVar1);
      sqlite3BuiltinFunctions.a[iVar1] = aDef + (int)pOther;
    }
    else {
      aDef[(int)pOther].pNext = pFVar2->pNext;
      pFVar2->pNext = aDef + (int)pOther;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3InsertBuiltinFuncs(
  FuncDef *aDef,      /* List of global functions to be inserted */
  int nDef            /* Length of the apDef[] list */
){
  int i;
  for(i=0; i<nDef; i++){
    FuncDef *pOther;
    const char *zName = aDef[i].zName;
    int nName = sqlite3Strlen30(zName);
    int h = (zName[0] + nName) % SQLITE_FUNC_HASH_SZ;
    assert( zName[0]>='a' && zName[0]<='z' );
    pOther = functionSearch(h, zName);
    if( pOther ){
      assert( pOther!=&aDef[i] && pOther->pNext!=&aDef[i] );
      aDef[i].pNext = pOther->pNext;
      pOther->pNext = &aDef[i];
    }else{
      aDef[i].pNext = 0;
      aDef[i].u.pHash = sqlite3BuiltinFunctions.a[h];
      sqlite3BuiltinFunctions.a[h] = &aDef[i];
    }
  }
}